

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rational.cpp
# Opt level: O0

void anon_unknown.dwarf_6260c::test_copy_construction<unsigned_int>(void)

{
  bool bVar1;
  ResultBuilder *pRVar2;
  ExpressionLhs<const_unsigned_int_&> EVar3;
  value_type_conflict5 local_5f8;
  value_type_conflict5 local_5f4;
  ExpressionLhs<const_unsigned_int_&> local_5f0;
  SourceLineInfo local_5e0;
  undefined1 local_5b8 [8];
  ResultBuilder __catchResult_1;
  ExpressionLhs<const_unsigned_int_&> local_310 [2];
  SourceLineInfo local_2f0;
  undefined1 local_2c8 [8];
  ResultBuilder __catchResult;
  rational r2_1;
  rational r1_1;
  rational r2;
  rational r1;
  
  tcb::rational<unsigned_int>::rational(&r2_1,3,2);
  __catchResult._664_8_ = r2_1;
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2f0,
               "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
               ,0x4b);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_2c8,"REQUIRE",&local_2f0,"r2.num() == r1.num()",Normal,"");
    Catch::SourceLineInfo::~SourceLineInfo(&local_2f0);
    __catchResult_1._668_4_ =
         tcb::rational<unsigned_int>::num
                   ((rational<unsigned_int> *)&__catchResult.m_shouldDebugBreak);
    EVar3 = Catch::ResultBuilder::operator<=
                      ((ResultBuilder *)local_2c8,(uint *)&__catchResult_1.field_0x29c);
    local_310[0] = EVar3;
    __catchResult_1._664_4_ = tcb::rational<unsigned_int>::num(&r2_1);
    pRVar2 = Catch::ExpressionLhs<unsigned_int_const&>::operator==
                       ((ExpressionLhs<unsigned_int_const&> *)local_310,
                        (uint *)&__catchResult_1.m_shouldDebugBreak);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_2c8);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_2c8);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_2c8);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_5e0,
               "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
               ,0x4c);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_5b8,"REQUIRE",&local_5e0,"r2.denom() == r1.denom()",Normal,"")
    ;
    Catch::SourceLineInfo::~SourceLineInfo(&local_5e0);
    local_5f4 = tcb::rational<unsigned_int>::denom
                          ((rational<unsigned_int> *)&__catchResult.m_shouldDebugBreak);
    EVar3 = Catch::ResultBuilder::operator<=((ResultBuilder *)local_5b8,&local_5f4);
    local_5f0 = EVar3;
    local_5f8 = tcb::rational<unsigned_int>::denom(&r2_1);
    pRVar2 = Catch::ExpressionLhs<unsigned_int_const&>::operator==
                       ((ExpressionLhs<unsigned_int_const&> *)&local_5f0,&local_5f8);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_5b8);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_5b8);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_5b8);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  return;
}

Assistant:

void test_copy_construction()
{
    using rational = tcb::rational<T>;
    
#ifdef TCB_HAVE_CONSTEXPR14
	{
		constexpr rational r1{3, 2};
        constexpr rational r2{r1};
        static_assert(r2.num() == r1.num(), "");
        static_assert(r2.denom() == r1.denom(), "");
    }
#endif

    {
		const rational r1{3, 2};
        const rational r2{r1};
        REQUIRE(r2.num() == r1.num());
        REQUIRE(r2.denom() == r1.denom());
    }
}